

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O2

void __thiscall
TxIndex::TxIndex(TxIndex *this,
                unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,
                size_t n_cache_size,bool f_memory,bool f_wipe)

{
  string name;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff98 [16];
  long *plVar1;
  undefined6 in_stack_ffffffffffffffb0;
  size_t local_48;
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)chain._M_t.
                     super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                     .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  local_48 = n_cache_size;
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"txindex",(allocator<char> *)&stack0xffffffffffffffa7);
  name.field_2._M_allocated_capacity = (size_type)plVar1;
  name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff98._0_8_;
  name._M_string_length = in_stack_ffffffffffffff98._8_8_;
  name.field_2._8_6_ = in_stack_ffffffffffffffb0;
  name.field_2._M_local_buf[0xe] = f_wipe;
  name.field_2._M_local_buf[0xf] = f_memory;
  BaseIndex::BaseIndex
            (&this->super_BaseIndex,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
             &stack0xffffffffffffffa8,name);
  std::__cxx11::string::~string(local_40);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  (this->super_BaseIndex).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_00a24e60;
  std::make_unique<TxIndex::DB,unsigned_long&,bool&,bool&>
            ((unsigned_long *)&this->m_db,(bool *)&local_48,(bool *)&stack0xffffffffffffffb7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TxIndex::TxIndex(std::unique_ptr<interfaces::Chain> chain, size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), "txindex"), m_db(std::make_unique<TxIndex::DB>(n_cache_size, f_memory, f_wipe))
{}